

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.h
# Opt level: O2

void __thiscall
Js::GlobalsScopeVariablesGroupDisplay::~GlobalsScopeVariablesGroupDisplay
          (GlobalsScopeVariablesGroupDisplay *this)

{
  operator_delete(this);
  return;
}

Assistant:

class GlobalsScopeVariablesGroupDisplay sealed : public RecyclableObjectDisplay
    {
    public:
        VariableWalkerBase *globalsGroupWalker;

        GlobalsScopeVariablesGroupDisplay(VariableWalkerBase *walker, ResolvedObject* resolvedObject);

        virtual LPCWSTR Type() override;
        virtual LPCWSTR Value(int radix) override;
        virtual BOOL HasChildren() override;
        virtual DBGPROP_ATTRIB_FLAGS GetTypeAttribute() override;
        virtual WeakArenaReference<IDiagObjectModelWalkerBase>* CreateWalker() override;
    }